

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptors(Generator *this)

{
  Printer *this_00;
  FileDescriptor *pFVar1;
  ulong uVar2;
  long lVar3;
  int i;
  long lVar4;
  allocator local_39;
  string local_38;
  
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    pFVar1 = this->file_;
    uVar2 = (ulong)*(int *)(pFVar1 + 0x58);
    if ((long)uVar2 <= lVar4) break;
    FixForeignFieldsInDescriptor
              (this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar3),(Descriptor *)0x0);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
    AddMessageToFileDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar3));
    pFVar1 = this->file_;
    uVar2 = (ulong)*(uint *)(pFVar1 + 0x58);
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar1 + 0x68); lVar4 = lVar4 + 1) {
    AddEnumToFileDescriptor(this,(EnumDescriptor *)(*(long *)(pFVar1 + 0x70) + lVar3));
    pFVar1 = this->file_;
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar1 + 0x88); lVar4 = lVar4 + 1) {
    AddExtensionToFileDescriptor(this,(FieldDescriptor *)(*(long *)(pFVar1 + 0x98) + lVar3));
    pFVar1 = this->file_;
    lVar3 = lVar3 + 0xa8;
  }
  this_00 = this->printer_;
  std::__cxx11::string::string((string *)&local_38,"DESCRIPTOR",&local_39);
  io::Printer::Print(this_00,"_sym_db.RegisterFileDescriptor($name$)\n","name",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*file_->message_type(i), NULL);
  }
  for (int i = 0; i < file_->message_type_count(); ++i) {
    AddMessageToFileDescriptor(*file_->message_type(i));
  }
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    AddEnumToFileDescriptor(*file_->enum_type(i));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    AddExtensionToFileDescriptor(*file_->extension(i));
  }
  // TODO(jieluo): Move this register to PrintFileDescriptor() when
  // FieldDescriptor.file is added in generated file.
  printer_->Print("_sym_db.RegisterFileDescriptor($name$)\n", "name",
                  kDescriptorKey);
  printer_->Print("\n");
}